

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

void __thiscall CLIntercept::logError(CLIntercept *this,char *functionName,cl_int errorCode)

{
  ostream *poVar1;
  ostream *poVar2;
  int in_EDX;
  char *in_RSI;
  CLIntercept *in_RDI;
  double __x;
  lock_guard<std::mutex> lock;
  ostringstream ss;
  mutex_type *in_stack_fffffffffffffdc8;
  cl_int e;
  CEnumNameMap *in_stack_fffffffffffffe18;
  string local_1c0 [48];
  ostringstream local_190 [380];
  int local_14;
  char *local_10;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::operator<<((ostream *)local_190,"ERROR! ");
  poVar2 = std::operator<<(poVar1,local_10);
  e = (cl_int)((ulong)poVar1 >> 0x20);
  poVar1 = std::operator<<(poVar2," returned ");
  enumName(in_RDI);
  CEnumNameMap::name_abi_cxx11_(in_stack_fffffffffffffe18,e);
  poVar1 = std::operator<<(poVar1,local_1c0);
  poVar1 = std::operator<<(poVar1," (");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_14);
  std::operator<<(poVar1,")\n");
  std::__cxx11::string::~string(local_1c0);
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)poVar1,in_stack_fffffffffffffdc8);
  __x = (double)std::__cxx11::ostringstream::str();
  log(in_RDI,__x);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe18);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1f51f0);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return;
}

Assistant:

void CLIntercept::logError(
    const char* functionName,
    cl_int errorCode )
{
    std::ostringstream  ss;
    ss << "ERROR! " << functionName << " returned " << enumName().name(errorCode) << " (" << errorCode << ")\n";

    std::lock_guard<std::mutex> lock(m_Mutex);
    log( ss.str() );
}